

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var __thiscall cs_impl::runtime_cs_ext::await_s(runtime_cs_ext *this,var *func,array *args)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar3;
  object_method *poVar4;
  initializer_list<cs_impl::any> __l;
  allocator_type local_d1;
  any local_d0;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_c8;
  vector local_b0;
  _Any_data local_98;
  code *local_88;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_70;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_58;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_38;
  
  if (func->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if ((pcVar1 != "N2cs8callableE") &&
     ((*pcVar1 == '*' || (iVar2 = strcmp(pcVar1,"N2cs8callableE"), iVar2 != 0)))) {
    if (func->mDat == (proxy *)0x0) {
      puVar3 = &void::typeinfo;
    }
    else {
      iVar2 = (*func->mDat->data->_vptr_baseHolder[2])();
      puVar3 = (undefined *)CONCAT44(extraout_var_00,iVar2);
    }
    pcVar1 = *(char **)(puVar3 + 8);
    if ((pcVar1 == "N2cs13object_methodE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N2cs13object_methodE"), iVar2 == 0)))) {
      poVar4 = any::const_val<cs::object_method>(func);
      local_d0.mDat = (poVar4->object).mDat;
      if (local_d0.mDat != (proxy *)0x0) {
        (local_d0.mDat)->refcount = (local_d0.mDat)->refcount + 1;
      }
      __l._M_len = 1;
      __l._M_array = &local_d0;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&local_c8,__l,&local_d1);
      async_callable::async_callable((async_callable *)&local_98,&poVar4->callable,&local_c8,args);
      fiber::await<cs_impl::runtime_cs_ext::async_callable>((async_callable *)this);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_70);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_c8);
      any::recycle(&local_d0);
    }
    else {
      any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    }
    return (var)(proxy *)this;
  }
  local_38._M_cur =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_38._M_first =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_38._M_last =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_38._M_node =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_58._M_cur =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
  vector<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
            ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&local_b0,&local_38,&local_58,
             (allocator_type *)&local_d0);
  async_callable::async_callable((async_callable *)&local_98,func,&local_b0);
  fiber::await<cs_impl::runtime_cs_ext::async_callable>((async_callable *)this);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_70);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_b0);
  return (var)(proxy *)this;
}

Assistant:

var await_s(const var &func, const array &args)
		{
			if (func.type() == typeid(callable)) {
				return fiber::await(async_callable(func, vector(args.begin(), args.end())));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				return fiber::await(async_callable(om.callable, {om.object}, args));
			}
			return null_pointer;
		}